

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt __thiscall slang::SVInt::shl(SVInt *this,bitwidth_t amount)

{
  bool bVar1;
  uint32_t uVar2;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  SVInt *in_RSI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar4;
  uint32_t offset;
  uint32_t wordShift;
  uint32_t numWords;
  uint32_t i;
  uint64_t carry;
  SVInt *result;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffa4;
  bitwidth_t bits;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this_00;
  uint in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  SVInt *in_stack_ffffffffffffffd0;
  uint local_24;
  ulong local_20;
  
  if (in_EDX == 0) {
    SVInt((SVInt *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (SVInt *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    uVar3 = extraout_RDX;
    this_00 = in_RDI;
  }
  else if (in_EDX < (in_RSI->super_SVIntStorage).bitWidth) {
    this_00 = in_RDI;
    bVar1 = isSingleWord(in_RSI);
    bits = (bitwidth_t)((ulong)in_RDI >> 0x20);
    if (bVar1) {
      SVInt((SVInt *)this_00.pVal,bits,CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
            ,SUB41((uint)in_stack_ffffffffffffff9c >> 0x18,0));
      uVar3 = extraout_RDX_01;
    }
    else {
      allocUninitialized(bits,SUB81((ulong)in_RDI >> 0x18,0),SUB81((ulong)in_RDI >> 0x10,0));
      if ((in_EDX < 0x40) && (((in_RSI->super_SVIntStorage).unknownFlag & 1U) == 0)) {
        local_20 = 0;
        local_24 = 0;
        while (uVar5 = local_24, uVar2 = getNumWords((SVInt *)0x206fe3), uVar5 < uVar2) {
          *(uint64_t *)(*in_RDI.pVal + (ulong)local_24 * 8) =
               (in_RSI->super_SVIntStorage).field_0.pVal[local_24] << ((byte)in_EDX & 0x3f) |
               local_20;
          local_20 = (in_RSI->super_SVIntStorage).field_0.pVal[local_24] >>
                     (0x40 - (byte)in_EDX & 0x3f);
          local_24 = local_24 + 1;
        }
      }
      else {
        uVar2 = getNumWords((in_RSI->super_SVIntStorage).bitWidth,false);
        in_stack_ffffffffffffffc4 = in_EDX & 0x3f;
        in_stack_ffffffffffffffc0 = in_EDX >> 6;
        shlFar((uint64_t *)*in_RDI.pVal,(in_RSI->super_SVIntStorage).field_0.pVal,
               in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,0,uVar2);
        if (((in_RSI->super_SVIntStorage).unknownFlag & 1U) != 0) {
          shlFar((uint64_t *)*in_RDI.pVal,(in_RSI->super_SVIntStorage).field_0.pVal,
                 in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,uVar2,uVar2);
        }
      }
      clearUnusedBits(in_stack_ffffffffffffffd0);
      checkUnknown((SVInt *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      uVar3 = extraout_RDX_02;
    }
  }
  else {
    SVInt((SVInt *)in_RDI.pVal,(bitwidth_t)((ulong)in_RDI >> 0x20),
          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          SUB41((uint)in_stack_ffffffffffffff9c >> 0x18,0));
    uVar3 = extraout_RDX_00;
    this_00 = in_RDI;
  }
  SVar4.super_SVIntStorage.bitWidth = (int)uVar3;
  SVar4.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar3 >> 0x20);
  SVar4.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar3 >> 0x28);
  SVar4.super_SVIntStorage._14_2_ = (short)((ulong)uVar3 >> 0x30);
  SVar4.super_SVIntStorage.field_0.val = this_00.val;
  return (SVInt)SVar4.super_SVIntStorage;
}

Assistant:

SVInt SVInt::shl(bitwidth_t amount) const {
    // handle trivial cases
    if (amount == 0)
        return *this;
    if (amount >= bitWidth) // if the shift amount is too large, we end up with zero anyway
        return SVInt(bitWidth, 0, signFlag);
    if (isSingleWord())
        return SVInt(bitWidth, val << amount, signFlag);

    // handle the small shift case
    SVInt result = allocUninitialized(bitWidth, signFlag, unknownFlag);
    if (amount < BITS_PER_WORD && !unknownFlag) {
        uint64_t carry = 0;
        for (uint32_t i = 0; i < getNumWords(); i++) {
            result.pVal[i] = pVal[i] << amount | carry;
            carry = pVal[i] >> (BITS_PER_WORD - amount);
        }
    }
    else {
        // otherwise do a full shift
        uint32_t numWords = getNumWords(bitWidth, false);
        uint32_t wordShift = amount % BITS_PER_WORD;
        uint32_t offset = amount / BITS_PER_WORD;

        // also handle shifting the unknown bits if necessary
        shlFar(result.pVal, pVal, wordShift, offset, 0, numWords);
        if (unknownFlag)
            shlFar(result.pVal, pVal, wordShift, offset, numWords, numWords);
    }

    result.clearUnusedBits();
    result.checkUnknown();
    return result;
}